

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

char * __thiscall
testing::internal::UntypedFunctionMockerBase::Name(UntypedFunctionMockerBase *this)

{
  char *pcVar1;
  MutexBase *in_RDI;
  MutexLock l;
  char *name;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int line;
  allocator<char> *file;
  undefined1 in_stack_ffffffffffffffb7;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI)
  ;
  line = CONCAT13(*(long *)((long)&in_RDI->mutex_ + 0x10) != 0,(int3)in_stack_ffffffffffffffa4);
  file = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Assert((bool)in_stack_ffffffffffffffb7,(char *)file,line,(string *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = *(char **)((long)&in_RDI->mutex_ + 0x10);
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x3203a9);
  return pcVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  const char* name;
  {
    // We protect name_ under g_gmock_mutex in case this mock
    // function is called from two threads concurrently.
    MutexLock l(&g_gmock_mutex);
    Assert(name_ != NULL, __FILE__, __LINE__,
           "Name() must not be called before SetOwnerAndName() has "
           "been called.");
    name = name_;
  }
  return name;
}